

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

void __thiscall QAbstractProxyModelPrivate::emitHeaderDataChanged(QAbstractProxyModelPrivate *this)

{
  int iVar1;
  QAbstractProxyModel *this_00;
  QAbstractProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  int rowCount;
  int columnCount;
  QAbstractProxyModel *q;
  QAbstractItemModel *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  QAbstractProxyModel *pQVar2;
  int _t3;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  _t3 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(in_RDI);
  if (((byte)in_RDI->field_0xe0 >> 3 & 1) != 0) {
    pQVar2 = this_00;
    QModelIndex::QModelIndex((QModelIndex *)0x851dde);
    iVar1 = (*(pQVar2->super_QAbstractItemModel).super_QObject._vptr_QObject[0x10])(pQVar2,local_20)
    ;
    _t3 = (int)((ulong)pQVar2 >> 0x20);
    if (0 < iVar1) {
      QAbstractItemModel::headerDataChanged
                (in_stack_ffffffffffffff98,(Orientation)((ulong)in_RDI >> 0x20),(int)in_RDI,_t3);
    }
  }
  if (((byte)in_RDI->field_0xe0 >> 2 & 1) != 0) {
    QModelIndex::QModelIndex((QModelIndex *)0x851e41);
    iVar1 = (*(this_00->super_QAbstractItemModel).super_QObject._vptr_QObject[0xf])
                      (this_00,local_38);
    if (0 < iVar1) {
      QAbstractItemModel::headerDataChanged
                (&this_00->super_QAbstractItemModel,(Orientation)((ulong)in_RDI >> 0x20),(int)in_RDI
                 ,_t3);
    }
  }
  in_RDI->field_0xe0 = in_RDI->field_0xe0 & 0xf7;
  in_RDI->field_0xe0 = in_RDI->field_0xe0 & 0xfb;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractProxyModelPrivate::emitHeaderDataChanged()
{
    Q_Q(QAbstractProxyModel);

    if (updateHorizontalHeader) {
        if (auto columnCount = q->columnCount(); columnCount > 0)
            emit q->headerDataChanged(Qt::Horizontal, 0, columnCount - 1);
    }

    if (updateVerticalHeader) {
        if (auto rowCount = q->rowCount(); rowCount > 0)
            emit q->headerDataChanged(Qt::Vertical, 0, rowCount - 1);
    }

    updateHorizontalHeader = false;
    updateVerticalHeader = false;
}